

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

uint duckdb::Cast::Operation<signed_char,unsigned_int>(char input)

{
  bool bVar1;
  InvalidInputException *this;
  uint result;
  char in_stack_000001af;
  string *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  uint local_8;
  
  bVar1 = TryCast::Operation<signed_char,unsigned_int>
                    ((int8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
                     (uint32_t *)in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<signed_char,unsigned_int>(in_stack_000001af);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffffb8);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_8;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}